

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O2

DdNode * Cudd_addThreshold(DdManager *dd,DdNode **f,DdNode **g)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  
  pDVar2 = *f;
  pDVar1 = *g;
  if ((pDVar2 != pDVar1) && (pDVar2 != dd->plusinfinity)) {
    if ((pDVar2->index != 0x7fffffff) || (pDVar1->index != 0x7fffffff)) {
      return (DdNode *)0x0;
    }
    if ((pDVar2->type).value < (pDVar1->type).value) {
      pDVar2 = dd->zero;
    }
  }
  return pDVar2;
}

Assistant:

DdNode *
Cudd_addThreshold(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{
    DdNode *F, *G;

    F = *f; G = *g;
    if (F == G || F == DD_PLUS_INFINITY(dd)) return(F);
    if (cuddIsConstant(F) && cuddIsConstant(G)) {
        if (cuddV(F) >= cuddV(G)) {
            return(F);
        } else {
            return(DD_ZERO(dd));
        }
    }
    return(NULL);

}